

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseVectorSum.h
# Opt level: O0

void __thiscall HighsSparseVectorSum::add(HighsSparseVectorSum *this,HighsInt index,double value)

{
  bool bVar1;
  reference pvVar2;
  int in_ESI;
  HighsCDouble *in_RDI;
  double in_XMM0_Qa;
  double val;
  double in_stack_ffffffffffffffb8;
  value_type_conflict2 *in_stack_ffffffffffffffc8;
  HighsCDouble *in_stack_ffffffffffffffd0;
  HighsCDouble local_28;
  double local_18;
  int local_c;
  
  local_18 = in_XMM0_Qa;
  local_c = in_ESI;
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_RDI,(long)in_ESI);
  bVar1 = HighsCDouble::operator!=(in_RDI,in_stack_ffffffffffffffb8);
  if (bVar1) {
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_RDI,(long)local_c);
    HighsCDouble::operator+=(in_stack_ffffffffffffffd0,(double)in_stack_ffffffffffffffc8);
    in_stack_ffffffffffffffb8 = local_18;
  }
  else {
    HighsCDouble::HighsCDouble(&local_28,local_18);
    pvVar2 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_RDI,(long)local_c)
    ;
    pvVar2->hi = local_28.hi;
    pvVar2->lo = local_28.lo;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8);
  }
  std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
            ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_RDI,(long)local_c);
  bVar1 = HighsCDouble::operator==(in_RDI,in_stack_ffffffffffffffb8);
  if (bVar1) {
    val = std::numeric_limits<double>::min();
    HighsCDouble::HighsCDouble((HighsCDouble *)&stack0xffffffffffffffc8,val);
    pvVar2 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                       ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_RDI,(long)local_c)
    ;
    pvVar2->hi = (double)in_stack_ffffffffffffffc8;
    pvVar2->lo = (double)in_stack_ffffffffffffffd0;
  }
  return;
}

Assistant:

void add(HighsInt index, double value) {
    assert(index >= 0 && index < (HighsInt)values.size());
    if (values[index] != 0.0) {
      values[index] += value;
    } else {
      values[index] = value;
      nonzeroinds.push_back(index);
    }

    if (values[index] == 0.0)
      values[index] = std::numeric_limits<double>::min();
  }